

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O2

void Rwr_Trav2_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,int *pVolume)

{
  for (; ((pNode->field_0x11 & 0x40) == 0 && (pNode->TravId != p->nTravIds));
      pNode = (Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe)) {
    pNode->TravId = p->nTravIds;
    *pVolume = *pVolume + 1;
    Rwr_Trav2_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pVolume);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Adds one node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Rwr_Trav2_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    Rwr_Trav2_rec( p, Rwr_Regular(pNode->p0), pVolume );
    Rwr_Trav2_rec( p, Rwr_Regular(pNode->p1), pVolume );
}